

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::UCharCharacterIterator::setIndex32(UCharCharacterIterator *this,int32_t position)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  uint uVar5;
  int iVar6;
  
  iVar2 = (this->super_CharacterIterator).begin;
  iVar3 = (this->super_CharacterIterator).end;
  iVar6 = position;
  if (iVar3 < position) {
    iVar6 = iVar3;
  }
  if (position < iVar2) {
    iVar6 = iVar2;
  }
  if (iVar6 < iVar3) {
    pcVar4 = this->text;
    if ((iVar2 < iVar6) && ((pcVar4[iVar6] & 0xfc00U) == 0xdc00)) {
      iVar6 = iVar6 - (uint)((pcVar4[(long)iVar6 + -1] & 0xfc00U) == 0xd800);
    }
    (this->super_CharacterIterator).pos = iVar6;
    cVar1 = pcVar4[iVar6];
    uVar5 = (uint)(ushort)cVar1;
    if ((((cVar1 & 0xfc00U) == 0xd800) && (iVar6 + 1 != iVar3)) &&
       (((ushort)pcVar4[iVar6 + 1] & 0xfc00) == 0xdc00)) {
      uVar5 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar4[iVar6 + 1] + 0xfca02400;
    }
    return uVar5;
  }
  (this->super_CharacterIterator).pos = iVar6;
  return 0xffff;
}

Assistant:

UChar32
UCharCharacterIterator::setIndex32(int32_t position) {
    if(position < begin) {
        position = begin;
    } else if(position > end) {
        position = end;
    }
    if(position < end) {
        U16_SET_CP_START(text, begin, position);
        int32_t i = this->pos = position;
        UChar32 c;
        U16_NEXT(text, i, end, c);
        return c;
    } else {
        this->pos = position;
        return DONE;
    }
}